

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_index_update(zip_entry_mark_t *entry_mark,ssize_t last_index,ssize_t nxt_index)

{
  long local_28;
  ssize_t j;
  ssize_t nxt_index_local;
  ssize_t last_index_local;
  zip_entry_mark_t *entry_mark_local;
  
  for (local_28 = 0; local_28 < last_index; local_28 = local_28 + 1) {
    if (nxt_index <= entry_mark[local_28].file_index) {
      entry_mark[local_28].file_index = entry_mark[local_28].file_index + 1;
    }
  }
  entry_mark[nxt_index].file_index = last_index;
  return 0;
}

Assistant:

static int zip_index_update(struct zip_entry_mark_t *entry_mark,
                            ssize_t last_index, ssize_t nxt_index) {
  ssize_t j;
  for (j = 0; j < last_index; j++) {
    if (entry_mark[j].file_index >= nxt_index) {
      entry_mark[j].file_index += 1;
    }
  }
  entry_mark[nxt_index].file_index = last_index;
  return 0;
}